

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test_utils.hpp
# Opt level: O2

void __thiscall
unodb::test::detail::
assert_value_eq<unodb::olc_db<unsigned_long,std::span<std::byte_const,18446744073709551615ul>>>
          (detail *this,get_result *result,value_view expected)

{
  char *in_R9;
  string local_58;
  get_result *local_38;
  value_view expected_local;
  AssertionResult gtest_ar_;
  AssertHelper local_10;
  
  expected_local._M_ptr = expected._M_ptr;
  local_38 = result;
  if (this[0x10] != (detail)0x0) {
    expected_local._M_extent._M_extent_value._0_1_ =
         std::ranges::__equal_fn::
         operator()<const_unodb::qsbr_ptr_span<const_std::byte>_&,_std::span<const_std::byte,_18446744073709551615UL>_&,_std::ranges::equal_to,_std::identity,_std::identity>
                   ((__equal_fn *)&std::ranges::equal,this,&local_38,
                    expected._M_extent._M_extent_value._M_extent_value);
    gtest_ar_.success_ = false;
    gtest_ar_._1_7_ = 0;
    if (!(bool)(undefined1)expected_local._M_extent._M_extent_value) {
      testing::Message::Message((Message *)&gtest_ar_.message_);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_58,(internal *)&expected_local._M_extent,
                 (AssertionResult *)"std::ranges::equal(*result, expected)","false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_10,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                 ,100,local_58._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_10,(Message *)&gtest_ar_.message_);
      testing::internal::AssertHelper::~AssertHelper(&local_10);
      std::__cxx11::string::~string((string *)&local_58);
      if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )gtest_ar_.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
          (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )0x0) {
        (**(code **)(*(long *)gtest_ar_.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl + 8))();
      }
    }
    std::
    unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&gtest_ar_);
    return;
  }
  __assert_fail("result.has_value()",
                "/workspace/llm4binary/github/license_c_cmakelists/laurynas-biveinis[P]unodb/test/db_test_utils.hpp"
                ,99,
                "void unodb::test::detail::assert_value_eq(const typename Db::get_result &, unodb::value_view) [Db = unodb::olc_db<std::uint64_t, unodb::value_view>]"
               );
}

Assistant:

void assert_value_eq(const typename Db::get_result &result,
                     unodb::value_view expected) noexcept {
  if constexpr (is_mutex_db<Db>) {
    UNODB_DETAIL_ASSERT(result.second.owns_lock());
    UNODB_DETAIL_ASSERT(result.first.has_value());
    UNODB_ASSERT_TRUE(std::ranges::equal(*result.first, expected));
  } else {
    UNODB_DETAIL_ASSERT(result.has_value());
    UNODB_ASSERT_TRUE(std::ranges::equal(*result, expected));
  }
}